

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.h
# Opt level: O0

void __thiscall slang::ast::SystemSubroutine::~SystemSubroutine(SystemSubroutine *this)

{
  code *pcVar1;
  SystemSubroutine *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~SystemSubroutine() = default;